

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_pipe_ref(void)

{
  uv_idle_t *handle;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  undefined1 auStack_690 [8];
  uv_idle_t uStack_688;
  uv_loop_t *puStack_630;
  long lStack_628;
  long lStack_620;
  uv_loop_t *puStack_618;
  char *pcStack_610;
  undefined8 uStack_608;
  size_t sStack_5f8;
  uv_process_options_t uStack_5f0;
  uv_process_t auStack_5a0 [3];
  uv_loop_t *puStack_430;
  undefined1 auStack_408 [496];
  uv_loop_t *puStack_218;
  void *pvStack_208;
  void *pvStack_200;
  uv_pipe_t uStack_1f8;
  uv_loop_t *puStack_110;
  long local_100;
  long local_f8;
  uv_pipe_t local_f0;
  
  puStack_110 = (uv_loop_t *)0x1b6261;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b6273;
  uv_pipe_init(puVar2,&local_f0,0);
  puStack_110 = (uv_loop_t *)0x1b627b;
  uv_unref((uv_handle_t *)&local_f0);
  puStack_110 = (uv_loop_t *)0x1b6280;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b628a;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_110 = (uv_loop_t *)0x1b6292;
  do_close(&local_f0);
  puStack_110 = (uv_loop_t *)0x1b6297;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b62ab;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_110 = (uv_loop_t *)0x1b62b5;
  uv_run(puVar2,UV_RUN_DEFAULT);
  local_f8 = 0;
  puStack_110 = (uv_loop_t *)0x1b62c3;
  puVar3 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b62cb;
  iVar1 = uv_loop_close(puVar3);
  local_100 = (long)iVar1;
  if (local_f8 == local_100) {
    puStack_110 = (uv_loop_t *)0x1b62e3;
    uv_library_shutdown();
    return 0;
  }
  puStack_110 = (uv_loop_t *)run_test_pipe_ref2;
  run_test_pipe_ref_cold_1();
  puStack_218 = (uv_loop_t *)0x1b630a;
  puStack_110 = puVar2;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1b631c;
  uv_pipe_init(puVar2,&uStack_1f8,0);
  puStack_218 = (uv_loop_t *)0x1b6330;
  uv_listen((uv_stream_t *)&uStack_1f8,0x80,fail_cb);
  puStack_218 = (uv_loop_t *)0x1b6338;
  uv_unref((uv_handle_t *)&uStack_1f8);
  puStack_218 = (uv_loop_t *)0x1b633d;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1b6347;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_218 = (uv_loop_t *)0x1b634f;
  do_close(&uStack_1f8);
  puStack_218 = (uv_loop_t *)0x1b6354;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1b6368;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_218 = (uv_loop_t *)0x1b6372;
  uv_run(puVar2,UV_RUN_DEFAULT);
  pvStack_200 = (void *)0x0;
  puStack_218 = (uv_loop_t *)0x1b6380;
  puVar3 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1b6388;
  iVar1 = uv_loop_close(puVar3);
  pvStack_208 = (void *)(long)iVar1;
  if (pvStack_200 == pvStack_208) {
    puStack_218 = (uv_loop_t *)0x1b63a0;
    uv_library_shutdown();
    return 0;
  }
  puStack_218 = (uv_loop_t *)run_test_pipe_ref3;
  run_test_pipe_ref2_cold_1();
  auStack_408._232_8_ = (uv__queue *)0x1b63c7;
  puStack_218 = puVar2;
  puVar3 = uv_default_loop();
  puVar2 = (uv_loop_t *)(auStack_408 + 0x108);
  auStack_408._232_8_ = (uv__queue *)0x1b63d9;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar2,0);
  auStack_408._232_8_ = (uv__queue *)0x1b63f6;
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar2,"/tmp/uv-test-sock",connect_and_shutdown);
  auStack_408._232_8_ = (uv__queue *)0x1b63fe;
  uv_unref((uv_handle_t *)puVar2);
  auStack_408._232_8_ = (uv__queue *)0x1b6403;
  puVar3 = uv_default_loop();
  auStack_408._232_8_ = (uv__queue *)0x1b640d;
  uv_run(puVar3,UV_RUN_DEFAULT);
  auStack_408._256_8_ = (uv_handle_t *)0x1;
  auStack_408._248_8_ = SEXT48(connect_cb_called);
  if ((uv_handle_t *)auStack_408._248_8_ == (uv_handle_t *)0x1) {
    auStack_408._256_8_ = (uv_handle_t *)0x1;
    auStack_408._248_8_ = SEXT48(shutdown_cb_called);
    if ((uv_handle_t *)auStack_408._248_8_ != (uv_handle_t *)0x1) goto LAB_001b64c8;
    auStack_408._232_8_ = (uv__queue *)0x1b645d;
    do_close(auStack_408 + 0x108);
    auStack_408._232_8_ = (uv__queue *)0x1b6462;
    puVar2 = uv_default_loop();
    auStack_408._232_8_ = (uv__queue *)0x1b6476;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_408._232_8_ = (uv__queue *)0x1b6480;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_408._256_8_ = (uv_handle_t *)0x0;
    auStack_408._232_8_ = (uv__queue *)0x1b648e;
    puVar3 = uv_default_loop();
    auStack_408._232_8_ = (uv__queue *)0x1b6496;
    iVar1 = uv_loop_close(puVar3);
    auStack_408._248_8_ = SEXT48(iVar1);
    if (auStack_408._256_8_ == auStack_408._248_8_) {
      auStack_408._232_8_ = (uv__queue *)0x1b64ae;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_408._232_8_ = (uv__queue *)0x1b64c8;
    run_test_pipe_ref3_cold_1();
LAB_001b64c8:
    auStack_408._232_8_ = (uv__queue *)0x1b64d7;
    run_test_pipe_ref3_cold_2();
  }
  auStack_408._232_8_ = run_test_pipe_ref4;
  run_test_pipe_ref3_cold_3();
  auStack_408._232_8_ = puVar2;
  puVar3 = uv_default_loop();
  puVar2 = (uv_loop_t *)auStack_408;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar2,0);
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar2,"/tmp/uv-test-sock",connect_and_write);
  uv_unref((uv_handle_t *)puVar2);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  if (connect_cb_called == 1) {
    if (write_cb_called != 1) goto LAB_001b661d;
    if (shutdown_cb_called != 1) goto LAB_001b662c;
    do_close(auStack_408);
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_pipe_ref4_cold_1();
LAB_001b661d:
    run_test_pipe_ref4_cold_2();
LAB_001b662c:
    run_test_pipe_ref4_cold_3();
  }
  run_test_pipe_ref4_cold_4();
  uStack_608 = 0;
  puStack_618 = (uv_loop_t *)0x0;
  pcStack_610 = "spawn_helper4";
  uStack_5f0.env = (char **)0x0;
  uStack_5f0.cwd = (char *)0x0;
  uStack_5f0.flags = 0;
  uStack_5f0.stdio_count = 0;
  uStack_5f0.stdio = (uv_stdio_container_t *)0x0;
  uStack_5f0.uid = 0;
  uStack_5f0.gid = 0;
  uStack_5f0.cpumask = (char *)0x0;
  uStack_5f0.cpumask_size = 0;
  sStack_5f8 = 0x100;
  puVar3 = (uv_loop_t *)(auStack_5a0 + 1);
  puStack_630 = (uv_loop_t *)0x1b66a5;
  puStack_430 = puVar2;
  iVar1 = uv_exepath((char *)puVar3,&sStack_5f8);
  auStack_5a0[0].data = (void *)(long)iVar1;
  lStack_628 = 0;
  if (auStack_5a0[0].data == (void *)0x0) {
    uStack_5f0.args = (char **)&puStack_618;
    uStack_5f0.exit_cb = (uv_exit_cb)0x0;
    puStack_630 = (uv_loop_t *)0x1b66e4;
    puStack_618 = puVar3;
    uStack_5f0.file = (char *)puVar3;
    puVar2 = uv_default_loop();
    puStack_630 = (uv_loop_t *)0x1b66f7;
    iVar1 = uv_spawn(puVar2,auStack_5a0,&uStack_5f0);
    lStack_628 = (long)iVar1;
    lStack_620 = 0;
    puVar3 = (uv_loop_t *)0x0;
    if (lStack_628 != 0) goto LAB_001b67d4;
    puVar3 = (uv_loop_t *)auStack_5a0;
    puStack_630 = (uv_loop_t *)0x1b6721;
    uv_unref((uv_handle_t *)puVar3);
    puStack_630 = (uv_loop_t *)0x1b6726;
    puVar2 = uv_default_loop();
    puStack_630 = (uv_loop_t *)0x1b6730;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_630 = (uv_loop_t *)0x1b673d;
    iVar1 = uv_process_kill((uv_process_t *)puVar3,0xf);
    lStack_628 = (long)iVar1;
    lStack_620 = 0;
    if (lStack_628 != 0) goto LAB_001b67e1;
    puStack_630 = (uv_loop_t *)0x1b6768;
    do_close(auStack_5a0);
    puStack_630 = (uv_loop_t *)0x1b676d;
    puVar3 = uv_default_loop();
    puStack_630 = (uv_loop_t *)0x1b6781;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_630 = (uv_loop_t *)0x1b678b;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_628 = 0;
    puStack_630 = (uv_loop_t *)0x1b6798;
    puVar2 = uv_default_loop();
    puStack_630 = (uv_loop_t *)0x1b67a0;
    iVar1 = uv_loop_close(puVar2);
    lStack_620 = (long)iVar1;
    if (lStack_628 == lStack_620) {
      puStack_630 = (uv_loop_t *)0x1b67b7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_630 = (uv_loop_t *)0x1b67d4;
    run_test_process_ref_cold_1();
LAB_001b67d4:
    puStack_630 = (uv_loop_t *)0x1b67e1;
    run_test_process_ref_cold_2();
LAB_001b67e1:
    puStack_630 = (uv_loop_t *)0x1b67ee;
    run_test_process_ref_cold_3();
  }
  puStack_630 = (uv_loop_t *)run_test_has_ref;
  run_test_process_ref_cold_4();
  puStack_630 = puVar3;
  puVar2 = uv_default_loop();
  handle = (uv_idle_t *)(auStack_690 + 8);
  uv_idle_init(puVar2,handle);
  uv_ref((uv_handle_t *)handle);
  auStack_690 = (undefined1  [8])0x1;
  iVar1 = uv_has_ref((uv_handle_t *)handle);
  if (auStack_690 == (undefined1  [8])(long)iVar1) {
    uv_unref((uv_handle_t *)(auStack_690 + 8));
    iVar1 = uv_has_ref((uv_handle_t *)(auStack_690 + 8));
    auStack_690 = (undefined1  [8])(long)iVar1;
    if (auStack_690 == (undefined1  [8])0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_690 = (undefined1  [8])0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (auStack_690 == (undefined1  [8])(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b68ed;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_001b68ed:
  handle_00 = (uv_handle_t *)auStack_690;
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_ref) {
  uv_pipe_t h;
  uv_pipe_init(uv_default_loop(), &h, 0);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}